

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaneBasedExecutionQueue.cpp
# Opt level: O3

ExecutionQueue *
llbuild::basic::createLaneBasedExecutionQueue
          (ExecutionQueueDelegate *delegate,int numLanes,SchedulerAlgorithm alg,QualityOfService qos
          ,char **environment)

{
  bool bVar1;
  undefined4 uVar2;
  uint uVar3;
  ExecutionQueue *this;
  ExecutionQueueDelegate *pEVar4;
  llbuild_rlim_t lVar5;
  long *plVar6;
  llvm *this_00;
  char *pcVar7;
  undefined8 uVar8;
  uint uVar9;
  int iVar10;
  llbuild_rlim_t lVar11;
  ExecutionQueueDelegate *pEVar12;
  StringRef Str;
  unsigned_long_long ULLVal;
  int *local_13c0;
  anon_union_5000_2_650ea050_for_random_device_0 local_13b8;
  
  pEVar12 = (ExecutionQueueDelegate *)environment;
  if (environment == (char **)0x0) {
    pEVar12 = _environ;
  }
  this = (ExecutionQueue *)operator_new(0x230);
  ExecutionQueue::ExecutionQueue(this,delegate);
  this->_vptr_ExecutionQueue = (_func_int **)&PTR__LaneBasedExecutionQueue_0020ca98;
  std::random_device::random_device((random_device *)&local_13b8.field_0);
  uVar2 = std::random_device::_M_getval();
  std::random_device::_M_fini();
  *(undefined4 *)&this[1]._vptr_ExecutionQueue = uVar2;
  this[1].delegate = (ExecutionQueueDelegate *)0x0;
  this[2]._vptr_ExecutionQueue = (_func_int **)0x0;
  this[2].delegate = (ExecutionQueueDelegate *)0x0;
  *(QualityOfService *)&this[3]._vptr_ExecutionQueue = qos;
  if (alg == FIFO) {
    pEVar4 = (ExecutionQueueDelegate *)operator_new(0x58);
    (pEVar4->super_ProcessDelegate)._vptr_ProcessDelegate =
         (_func_int **)&PTR__FifoScheduler_0020cb10;
    pEVar4[1].super_ProcessDelegate._vptr_ProcessDelegate = (_func_int **)0x0;
    pEVar4[2].super_ProcessDelegate._vptr_ProcessDelegate = (_func_int **)0x0;
    pEVar4[3].super_ProcessDelegate._vptr_ProcessDelegate = (_func_int **)0x0;
    pEVar4[4].super_ProcessDelegate._vptr_ProcessDelegate = (_func_int **)0x0;
    pEVar4[5].super_ProcessDelegate._vptr_ProcessDelegate = (_func_int **)0x0;
    pEVar4[6].super_ProcessDelegate._vptr_ProcessDelegate = (_func_int **)0x0;
    pEVar4[7].super_ProcessDelegate._vptr_ProcessDelegate = (_func_int **)0x0;
    pEVar4[8].super_ProcessDelegate._vptr_ProcessDelegate = (_func_int **)0x0;
    pEVar4[9].super_ProcessDelegate._vptr_ProcessDelegate = (_func_int **)0x0;
    pEVar4[10].super_ProcessDelegate._vptr_ProcessDelegate = (_func_int **)0x0;
    std::_Deque_base<llbuild::basic::QueueJob,_std::allocator<llbuild::basic::QueueJob>_>::
    _M_initialize_map((_Deque_base<llbuild::basic::QueueJob,_std::allocator<llbuild::basic::QueueJob>_>
                       *)(pEVar4 + 1),0);
  }
  else {
    if (alg != NamePriority) {
      __assert_fail("0 && \"unknown scheduler algorithm\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/LaneBasedExecutionQueue.cpp"
                    ,0x1df,
                    "static std::unique_ptr<Scheduler> (anonymous namespace)::Scheduler::make(SchedulerAlgorithm)"
                   );
    }
    pEVar4 = (ExecutionQueueDelegate *)operator_new(0x28);
    (pEVar4->super_ProcessDelegate)._vptr_ProcessDelegate =
         (_func_int **)&PTR__PriorityQueueScheduler_0020cad0;
    pEVar4[1].super_ProcessDelegate._vptr_ProcessDelegate = (_func_int **)0x0;
    pEVar4[2].super_ProcessDelegate._vptr_ProcessDelegate = (_func_int **)0x0;
    pEVar4[3].super_ProcessDelegate._vptr_ProcessDelegate = (_func_int **)0x0;
  }
  this[3].delegate = pEVar4;
  this[4]._vptr_ExecutionQueue = (_func_int **)&PTR__FifoScheduler_0020cb10;
  this[4].delegate = (ExecutionQueueDelegate *)0x0;
  this[5]._vptr_ExecutionQueue = (_func_int **)0x0;
  this[5].delegate = (ExecutionQueueDelegate *)0x0;
  this[6]._vptr_ExecutionQueue = (_func_int **)0x0;
  this[6].delegate = (ExecutionQueueDelegate *)0x0;
  this[7]._vptr_ExecutionQueue = (_func_int **)0x0;
  this[7].delegate = (ExecutionQueueDelegate *)0x0;
  this[8]._vptr_ExecutionQueue = (_func_int **)0x0;
  this[8].delegate = (ExecutionQueueDelegate *)0x0;
  this[9]._vptr_ExecutionQueue = (_func_int **)0x0;
  std::_Deque_base<llbuild::basic::QueueJob,_std::allocator<llbuild::basic::QueueJob>_>::
  _M_initialize_map((_Deque_base<llbuild::basic::QueueJob,_std::allocator<llbuild::basic::QueueJob>_>
                     *)&this[4].delegate,0);
  this[0xb].delegate = (ExecutionQueueDelegate *)0x0;
  this[10].delegate = (ExecutionQueueDelegate *)0x0;
  this[0xb]._vptr_ExecutionQueue = (_func_int **)0x0;
  this[9].delegate = (ExecutionQueueDelegate *)0x0;
  this[10]._vptr_ExecutionQueue = (_func_int **)0x0;
  std::condition_variable::condition_variable((condition_variable *)(this + 0xc));
  *(undefined2 *)&this[0xf]._vptr_ExecutionQueue = 0;
  this[0xf].delegate = (ExecutionQueueDelegate *)&this[0x12].delegate;
  this[0x10]._vptr_ExecutionQueue = (_func_int **)0x1;
  this[0x10].delegate = (ExecutionQueueDelegate *)0x0;
  this[0x11]._vptr_ExecutionQueue = (_func_int **)0x0;
  *(undefined4 *)&this[0x11].delegate = 0x3f800000;
  this[0x12]._vptr_ExecutionQueue = (_func_int **)0x0;
  this[0x12].delegate = (ExecutionQueueDelegate *)0x0;
  std::condition_variable::condition_variable((condition_variable *)(this + 0x13));
  *(undefined1 *)&this[0x16]._vptr_ExecutionQueue = 0;
  this[0x16].delegate = (ExecutionQueueDelegate *)0x0;
  this[0x17]._vptr_ExecutionQueue = (_func_int **)0x0;
  this[0x17].delegate = (ExecutionQueueDelegate *)0x0;
  this[0x18]._vptr_ExecutionQueue = (_func_int **)0x0;
  this[0x18].delegate = (ExecutionQueueDelegate *)0x0;
  this[0x19]._vptr_ExecutionQueue = (_func_int **)0x0;
  this[0x19].delegate = (ExecutionQueueDelegate *)0x0;
  this[0x1a]._vptr_ExecutionQueue = (_func_int **)0x0;
  this[0x1a].delegate = (ExecutionQueueDelegate *)0x0;
  this[0x1b]._vptr_ExecutionQueue = (_func_int **)0x0;
  this[0x1b].delegate = (ExecutionQueueDelegate *)0x0;
  std::condition_variable::condition_variable((condition_variable *)(this + 0x1c));
  *(undefined8 *)((long)&this[0x21].delegate + 4) = 0;
  this[0x1f]._vptr_ExecutionQueue = (_func_int **)0x0;
  this[0x1f].delegate = (ExecutionQueueDelegate *)0x0;
  this[0x20]._vptr_ExecutionQueue = (_func_int **)0x0;
  this[0x20].delegate = (ExecutionQueueDelegate *)0x0;
  *(undefined8 *)((long)&this[0x20].delegate + 1) = 0;
  *(undefined8 *)((long)&this[0x21]._vptr_ExecutionQueue + 1) = 0;
  this[0x22].delegate = pEVar12;
  lVar5 = sys::getOpenFileLimit();
  iVar10 = 1;
  if (9 < lVar5) {
    lVar11 = 0x7fffffff;
    if (lVar5 < 0x7fffffff) {
      lVar11 = lVar5;
    }
    uVar9 = (int)lVar11 - 10U >> 1;
    if ((uint)numLanes <= uVar9) {
      this_00 = (llvm *)getenv("LLBUILD_BACKGROUND_TASK_MAX");
      if (this_00 == (llvm *)0x0) {
LAB_0016b11e:
        uVar8 = ZEXT48((uint)(numLanes << 6));
        if (0x3ff < (uint)(numLanes << 6)) {
          uVar8 = (long *)0x400;
        }
      }
      else {
        pcVar7 = (char *)strlen((char *)this_00);
        Str.Length = 10;
        Str.Data = pcVar7;
        bVar1 = llvm::getAsUnsignedInteger
                          (this_00,Str,(uint)&local_13b8,(unsigned_long_long *)environment);
        if ((bVar1) ||
           (uVar8 = local_13b8.field_0._M_file, (ulong)local_13b8.field_0._M_file >> 0x20 != 0))
        goto LAB_0016b11e;
      }
      uVar3 = (uint)uVar8;
      if (uVar9 - numLanes < (uint)uVar8) {
        uVar3 = uVar9 - numLanes;
      }
      *(int *)((long)&this[1]._vptr_ExecutionQueue + 4) = numLanes;
      *(uint *)((long)&this[0x21].delegate + 4) = uVar3;
      if (numLanes == 0) {
        return this;
      }
      goto LAB_0016b00b;
    }
    iVar10 = uVar9 + (uVar9 == 0);
  }
  *(int *)((long)&this[1]._vptr_ExecutionQueue + 4) = iVar10;
  *(undefined4 *)((long)&this[0x21].delegate + 4) = 0;
LAB_0016b00b:
  local_13c0 = (int *)((long)&this[1]._vptr_ExecutionQueue + 4);
  iVar10 = 0;
  do {
    plVar6 = (long *)operator_new(8);
    uVar2 = *(undefined4 *)&this[1]._vptr_ExecutionQueue;
    *plVar6 = 0;
    local_13b8.field_0._M_file = operator_new(0x28);
    *(undefined ***)local_13b8.field_0._M_file = &PTR___State_0020cb78;
    *(int *)((long)local_13b8.field_0._M_file + 8) = iVar10;
    *(undefined4 *)((long)local_13b8.field_0._M_file + 0xc) = uVar2;
    *(ExecutionQueue **)((long)local_13b8.field_0._M_file + 0x10) = this;
    *(code **)((long)local_13b8.field_0._M_file + 0x18) =
         anon_unknown.dwarf_33a50c::LaneBasedExecutionQueue::executeLane;
    *(long *)((long)local_13b8.field_0._M_file + 0x20) = 0;
    std::thread::_M_start_thread(plVar6,&local_13b8,0);
    if ((long *)local_13b8.field_0._M_file != (long *)0x0) {
      (**(code **)(*local_13b8.field_0._M_file + 8))();
    }
    local_13b8.field_0._M_file = plVar6;
    std::
    vector<std::unique_ptr<std::thread,std::default_delete<std::thread>>,std::allocator<std::unique_ptr<std::thread,std::default_delete<std::thread>>>>
    ::emplace_back<std::unique_ptr<std::thread,std::default_delete<std::thread>>>
              ((vector<std::unique_ptr<std::thread,std::default_delete<std::thread>>,std::allocator<std::unique_ptr<std::thread,std::default_delete<std::thread>>>>
                *)&this[1].delegate,
               (unique_ptr<std::thread,_std::default_delete<std::thread>_> *)&local_13b8.field_0);
    if ((long *)local_13b8.field_0._M_file != (long *)0x0) {
      if (*local_13b8.field_0._M_file != 0) {
        std::terminate();
      }
      operator_delete(local_13b8.field_0._M_file,8);
    }
    iVar10 = iVar10 + 1;
  } while (iVar10 != *local_13c0);
  return this;
}

Assistant:

ExecutionQueue* llbuild::basic::createLaneBasedExecutionQueue(
    ExecutionQueueDelegate& delegate, int numLanes, SchedulerAlgorithm alg,
    QualityOfService qos, const char* const* environment
) {
  if (!environment) {
    environment = const_cast<const char* const*>(environ);
  }
  return new LaneBasedExecutionQueue(delegate, numLanes, alg, qos, environment);
}